

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

_tExecReaction __thiscall yactfr::internal::Vm::_execReadFlBitArrayBeRev(Vm *this,Instr *instr)

{
  FixedLengthBitArrayElement *elem;
  Index IVar1;
  Index IVar2;
  ElementSequenceIterator *pEVar3;
  unsigned_long uVar4;
  
  uVar4 = _readFlInt<unsigned_long,_yactfr::internal::(anonymous_namespace)::readFlUIntBeFuncs,_true>
                    (this,instr);
  elem = &(this->_pos).elems.flBitArray;
  IVar1 = (this->_pos).headOffsetInCurPktBits;
  IVar2 = (this->_pos).curPktOffsetInElemSeqBits;
  _setDataElemFromInstr<yactfr::FixedLengthBitArrayElement>(elem,instr);
  (this->_pos).lastIntVal.u = uVar4;
  (this->_pos).elems.flBitArray.super_NumberElement._theVal.u = uVar4;
  pEVar3 = this->_it;
  pEVar3->_curElem = (Element *)elem;
  pEVar3->_offset = IVar1 + IVar2;
  pEVar3->_mark = pEVar3->_mark + 1;
  _consumeExistingBits(this,(ulong)*(uint *)((long)&instr[2]._vptr_Instr + 4));
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execReadFlBitArrayBeRev(const Instr& instr)
{
    this->_execReadFlBitArray<readFlUIntBeFuncs, true>(instr);
    return _tExecReaction::FetchNextInstrAndStop;
}